

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O3

void tabplay_tilde_list(t_tabplay_tilde *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  int iVar2;
  t_float tVar3;
  t_float tVar4;
  
  iVar2 = 0;
  tVar3 = atom_getfloatarg(0,argc,argv);
  tVar4 = atom_getfloatarg(1,argc,argv);
  if (0 < (long)tVar3) {
    iVar2 = (int)(long)tVar3;
  }
  iVar1 = 0x7fffffff;
  if (0 < (long)tVar4) {
    iVar1 = iVar2 + (int)(long)tVar4;
  }
  x->x_limit = iVar1;
  x->x_phase = iVar2;
  return;
}

Assistant:

static void tabplay_tilde_list(t_tabplay_tilde *x, t_symbol *s,
    int argc, t_atom *argv)
{
    long start = atom_getfloatarg(0, argc, argv);
    long length = atom_getfloatarg(1, argc, argv);
    if (start < 0) start = 0;
    if (length <= 0)
        x->x_limit = 0x7fffffff;
    else
        x->x_limit = (int)(start + length);
    x->x_phase = (int)start;
}